

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

void __thiscall
Refal2::CProgramPrintHelper::Label(CProgramPrintHelper *this,ostream *outputStream,TLabel label)

{
  element_type *peVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = label + 0xffff;
  if (-1 < label) {
    iVar5 = label;
  }
  uVar4 = iVar5 >> 0x10;
  if ((this->super_CPrintHelper).printLabelWithModule == true) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)outputStream,uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  }
  if ((-0x10000 < label) &&
     (peVar1 = (this->program).super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, (int)uVar4 < peVar1->modulesSize)) {
    pbVar3 = CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::GetKey(&peVar1->modules[uVar4].Functions,label % 0x10000);
    std::__ostream_insert<char,std::char_traits<char>>
              (outputStream,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
    return;
  }
  __assert_fail("moduleId >= 0 && moduleId < modulesSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                ,0x18,"CRuntimeModule &Refal2::CProgram::Module(TRuntimeModuleId)");
}

Assistant:

void CProgramPrintHelper::Label( std::ostream& outputStream,
	const TLabel label ) const
{
	const int labelModuleId = label / LabelMask;
	if( PrintLabelWithModule() ) {
		outputStream << labelModuleId << ":";
	}
	outputStream << program->Module( labelModuleId ).Functions.
		GetKey(	label % LabelMask );
}